

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  
LAB_001670eb:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_00167115;
      if (s->read_from_callbacks != 0) goto LAB_00167105;
LAB_00167160:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_00167192;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_00167192:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001671b9:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_001670eb;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_001671b9;
            goto LAB_001670eb;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_001670eb;
        psVar3 = s->img_buffer;
        if (psVar3 < s->img_buffer_end) {
LAB_00167208:
          s->img_buffer = psVar3 + 1;
          sVar1 = *psVar3;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            psVar3 = s->img_buffer;
            goto LAB_00167208;
          }
          sVar1 = '\0';
        }
        *c = sVar1;
      } while( true );
    }
LAB_00167105:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00167160;
LAB_00167115:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_00167160;
    psVar3 = s->img_buffer;
    if (psVar3 < s->img_buffer_end) {
LAB_0016714a:
      s->img_buffer = psVar3 + 1;
      sVar1 = *psVar3;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar3 = s->img_buffer;
        goto LAB_0016714a;
      }
      sVar1 = '\0';
    }
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}